

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
               *values,ostream *os)

{
  MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *pMVar1;
  linked_ptr_internal lVar2;
  int iVar3;
  ostream *poVar4;
  Value value;
  type matcher;
  StringMatchResultListener listener;
  wchar_t *local_218;
  size_t sStack_210;
  undefined **local_200;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> local_1f8;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = &PTR__MatcherBase_001d4088;
  local_1f8.value_ =
       (matchers->f0_).super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.value_;
  lVar2.next_ = &local_1f8.link_;
  if (local_1f8.value_ != (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)0x0) {
    linked_ptr_internal::join
              (&local_1f8.link_,
               &(matchers->f0_).super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.link_)
    ;
    lVar2.next_ = local_1f8.link_.next_;
  }
  local_1f8.link_.next_ = lVar2.next_;
  local_200 = &PTR__MatcherBase_001d8008;
  local_218 = (values->f0_).data_;
  sStack_210 = (values->f0_).size_;
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_001d3c50;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar3 = (*((local_1f8.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4]
          )(local_1f8.value_,local_218,sStack_210,&local_1c8);
  if ((char)iVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    pMVar1 = (matchers->f0_).super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    internal2::PrintBytesInObjectTo((uchar *)&local_218,0x10,os);
    std::__cxx11::stringbuf::str();
    iVar3 = std::__cxx11::string::compare((char *)&local_1e8);
    if ((os != (ostream *)0x0) && (iVar3 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_001d3c50;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  local_200 = &PTR__MatcherBase_001d4088;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::~linked_ptr
            (&local_1f8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }